

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

void __thiscall
S2MinDistanceCellUnionTarget::~S2MinDistanceCellUnionTarget(S2MinDistanceCellUnionTarget *this)

{
  S2MinDistanceCellUnionTarget *this_local;
  
  (this->super_S2MinDistanceTarget)._vptr_S2DistanceTarget =
       (_func_int **)&PTR__S2MinDistanceCellUnionTarget_0062e7f8;
  std::unique_ptr<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>_>::~unique_ptr
            (&this->query_);
  S2CellIndex::~S2CellIndex(&this->index_);
  S2CellUnion::~S2CellUnion(&this->cell_union_);
  S2DistanceTarget<S2MinDistance>::~S2DistanceTarget(&this->super_S2MinDistanceTarget);
  return;
}

Assistant:

S2MinDistanceCellUnionTarget::~S2MinDistanceCellUnionTarget() {
}